

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_reflect.cpp
# Opt level: O1

void __thiscall simple_json::Stream::begin_json_object(Stream *this)

{
  undefined8 in_RAX;
  _Elt_pointer ppVar1;
  uint uVar2;
  undefined8 uStack_28;
  
  ppVar1 = (this->stack).c.
           super__Deque_base<std::pair<simple_json::Type,_bool>,_std::allocator<std::pair<simple_json::Type,_bool>_>_>
           ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  uStack_28 = in_RAX;
  if (ppVar1 != (this->stack).c.
                super__Deque_base<std::pair<simple_json::Type,_bool>,_std::allocator<std::pair<simple_json::Type,_bool>_>_>
                ._M_impl.super__Deque_impl_data._M_start._M_cur) {
    if (ppVar1 == (this->stack).c.
                  super__Deque_base<std::pair<simple_json::Type,_bool>,_std::allocator<std::pair<simple_json::Type,_bool>_>_>
                  ._M_impl.super__Deque_impl_data._M_finish._M_first) {
      ppVar1 = (this->stack).c.
               super__Deque_base<std::pair<simple_json::Type,_bool>,_std::allocator<std::pair<simple_json::Type,_bool>_>_>
               ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
    }
    if (ppVar1[-1].second == true) {
      spirv_cross::StringStream<4096UL,_4096UL>::append(&this->buffer,",\n",2);
    }
  }
  if (this->indent != 0) {
    uVar2 = 0;
    do {
      spirv_cross::StringStream<4096UL,_4096UL>::append(&this->buffer,"    ",4);
      uVar2 = uVar2 + 1;
    } while (uVar2 < this->indent);
  }
  spirv_cross::StringStream<4096UL,_4096UL>::append(&this->buffer,"{",1);
  uStack_28._0_4_ = CONCAT13(10,(uint3)uStack_28);
  spirv_cross::StringStream<4096UL,_4096UL>::append(&this->buffer,(char *)((long)&uStack_28 + 3),1);
  this->indent = this->indent + 1;
  uStack_28 = uStack_28 & 0xffffffff;
  uStack_28._0_3_ = (uint3)(ushort)uStack_28;
  ppVar1 = (this->stack).c.
           super__Deque_base<std::pair<simple_json::Type,_bool>,_std::allocator<std::pair<simple_json::Type,_bool>_>_>
           ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (ppVar1 == (this->stack).c.
                super__Deque_base<std::pair<simple_json::Type,_bool>,_std::allocator<std::pair<simple_json::Type,_bool>_>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
    std::deque<std::pair<simple_json::Type,bool>,std::allocator<std::pair<simple_json::Type,bool>>>
    ::_M_push_back_aux<simple_json::Type,bool>
              ((deque<std::pair<simple_json::Type,bool>,std::allocator<std::pair<simple_json::Type,bool>>>
                *)this,(Type *)((long)&uStack_28 + 4),(bool *)((long)&uStack_28 + 2));
  }
  else {
    ppVar1->first = Object;
    ppVar1->second = false;
    (this->stack).c.
    super__Deque_base<std::pair<simple_json::Type,_bool>,_std::allocator<std::pair<simple_json::Type,_bool>_>_>
    ._M_impl.super__Deque_impl_data._M_finish._M_cur = ppVar1 + 1;
  }
  return;
}

Assistant:

void Stream::begin_json_object()
{
	if (!stack.empty() && stack.top().second)
	{
		statement_inner(",\n");
	}
	statement("{");
	++indent;
	stack.emplace(Type::Object, false);
}